

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatTimeInMillisAsSeconds_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  uint *puVar1;
  long lVar2;
  stringstream ss;
  long local_188;
  long local_180 [2];
  uint auStack_170 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188 + -0x18)) & 0xfffffefb | 4;
  if ((long)this % 1000 == 0) {
    lVar2 = 0;
  }
  else if ((long)this % 100 == 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = 3 - (ulong)((long)this % 10 == 0);
  }
  *(long *)((long)local_180 + *(long *)(local_188 + -0x18)) = lVar2;
  puVar1 = (uint *)((long)auStack_170 + *(long *)(local_188 + -0x18));
  *puVar1 = *puVar1 | 0x400;
  std::ostream::_M_insert<double>((double)(long)this * 0.001);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatTimeInMillisAsSeconds(TimeInMillis ms) {
  ::std::stringstream ss;
  // For the exact N seconds, makes sure output has a trailing decimal point.
  // Sets precision so that we won't have many trailing zeros (e.g., 300 ms
  // will be just 0.3, 410 ms 0.41, and so on)
  ss << std::fixed
     << std::setprecision(
            ms % 1000 == 0 ? 0 : (ms % 100 == 0 ? 1 : (ms % 10 == 0 ? 2 : 3)))
     << std::showpoint;
  ss << (static_cast<double>(ms) * 1e-3);
  return ss.str();
}